

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint If_DsdSign_rec(If_DsdMan_t *p,If_DsdObj_t *pObj,int *pnSupp)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  If_DsdObj_t *local_38;
  If_DsdObj_t *pFanin;
  int i;
  uint uSign;
  int *pnSupp_local;
  If_DsdObj_t *pObj_local;
  If_DsdMan_t *p_local;
  
  pFanin._4_4_ = 0;
  iVar1 = If_DsdObjType(pObj);
  if (iVar1 == 2) {
    iVar1 = *pnSupp;
    *pnSupp = iVar1 + 1;
    p_local._4_4_ = 1 << ((byte)(iVar1 << 1) & 0x1f);
  }
  else {
    pFanin._0_4_ = 0;
    while( true ) {
      iVar1 = If_DsdObjFaninNum(pObj);
      bVar3 = false;
      if ((int)pFanin < iVar1) {
        local_38 = If_DsdObjFanin(&p->vObjs,pObj,(int)pFanin);
        bVar3 = local_38 != (If_DsdObj_t *)0x0;
      }
      if (!bVar3) break;
      uVar2 = If_DsdSign_rec(p,local_38,pnSupp);
      pFanin._4_4_ = uVar2 | pFanin._4_4_;
      pFanin._0_4_ = (int)pFanin + 1;
    }
    p_local._4_4_ = pFanin._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

unsigned If_DsdSign_rec( If_DsdMan_t * p, If_DsdObj_t * pObj, int * pnSupp )
{
    unsigned uSign = 0; int i;
    If_DsdObj_t * pFanin;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return (1 << (2*(*pnSupp)++));
    If_DsdObjForEachFanin( &p->vObjs, pObj, pFanin, i )
        uSign |= If_DsdSign_rec( p, pFanin, pnSupp );
    return uSign;
}